

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O1

void Llb_MnnStop(Llb_Mnn_t *p)

{
  DdNode *pDVar1;
  int *piVar2;
  long lVar3;
  int level;
  DdManager *dd;
  Vec_Ptr_t *pVVar4;
  double dVar5;
  double dVar6;
  
  if (p->pPars->fVerbose != 0) {
    dd = p->ddG;
    p->timeOther = p->timeTotal - (p->timeImage + p->timeTran1 + p->timeTran2 + p->timeGloba);
    lVar3 = Cudd_ReadReorderingTime(dd);
    p->timeReoG = lVar3;
    level = (int)dd;
    Abc_Print(level,"%s =","Image    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeImage * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeImage / 1000000.0,dVar5);
    Abc_Print(level,"%s =","  build  ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)timeBuild * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)timeBuild / 1000000.0,dVar5);
    Abc_Print(level,"%s =","  and-ex ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)timeAndEx * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)timeAndEx / 1000000.0,dVar5);
    Abc_Print(level,"%s =","  other  ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)timeOther / 1000000.0,dVar5);
    Abc_Print(level,"%s =","Transfer1");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeTran1 * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeTran1 / 1000000.0,dVar5);
    Abc_Print(level,"%s =","Transfer2");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeTran2 * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeTran2 / 1000000.0,dVar5);
    Abc_Print(level,"%s =","Global   ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeGloba * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeGloba / 1000000.0,dVar5);
    Abc_Print(level,"%s =","Other    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar5);
    Abc_Print(level,"%s =","TOTAL    ");
    dVar6 = (double)p->timeTotal;
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = (dVar6 * 100.0) / dVar6;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar5);
    Abc_Print(level,"%s =","  reo    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeReo * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeReo / 1000000.0,dVar5);
    Abc_Print(level,"%s =","  reoG   ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeReoG * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeReoG / 1000000.0,dVar5);
  }
  pDVar1 = p->ddR->bFunc;
  if (pDVar1 != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddR,pDVar1);
  }
  pVVar4 = p->vRings;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      Cudd_RecursiveDeref(p->ddR,(DdNode *)pVVar4->pArray[lVar3]);
      lVar3 = lVar3 + 1;
      pVVar4 = p->vRings;
    } while (lVar3 < pVVar4->nSize);
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pDVar1 = p->ddG->bFunc;
  if (pDVar1 != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddG,pDVar1);
  }
  pDVar1 = p->ddG->bFunc2;
  if (pDVar1 != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddG,pDVar1);
  }
  Extra_StopManager(p->ddG);
  Extra_StopManager(p->ddR);
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    piVar2 = p->vCs2Glo->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vCs2Glo->pArray = (int *)0x0;
    }
    if (p->vCs2Glo != (Vec_Int_t *)0x0) {
      free(p->vCs2Glo);
      p->vCs2Glo = (Vec_Int_t *)0x0;
    }
  }
  if (p->vNs2Glo != (Vec_Int_t *)0x0) {
    piVar2 = p->vNs2Glo->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vNs2Glo->pArray = (int *)0x0;
    }
    if (p->vNs2Glo != (Vec_Int_t *)0x0) {
      free(p->vNs2Glo);
      p->vNs2Glo = (Vec_Int_t *)0x0;
    }
  }
  if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
    piVar2 = p->vGlo2Cs->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vGlo2Cs->pArray = (int *)0x0;
    }
    if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
      free(p->vGlo2Cs);
      p->vGlo2Cs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
    piVar2 = p->vGlo2Ns->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vGlo2Ns->pArray = (int *)0x0;
    }
    if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
      free(p->vGlo2Ns);
      p->vGlo2Ns = (Vec_Int_t *)0x0;
    }
  }
  pVVar4 = p->vLeaves;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = p->vRoots;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  if (p->pVars2Q != (int *)0x0) {
    free(p->pVars2Q);
    p->pVars2Q = (int *)0x0;
  }
  if (p->pOrderL != (int *)0x0) {
    free(p->pOrderL);
    p->pOrderL = (int *)0x0;
  }
  if (p->pOrderL2 != (int *)0x0) {
    free(p->pOrderL2);
    p->pOrderL2 = (int *)0x0;
  }
  if (p->pOrderG != (int *)0x0) {
    free(p->pOrderG);
    p->pOrderG = (int *)0x0;
  }
  if (p != (Llb_Mnn_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Llb_MnnStop( Llb_Mnn_t * p )
{
    DdNode * bTemp;
    int i;
    if ( p->pPars->fVerbose ) 
    {
        p->timeOther = p->timeTotal - p->timeImage - p->timeTran1 - p->timeTran2 - p->timeGloba;
        p->timeReoG  = Cudd_ReadReorderingTime(p->ddG);
        ABC_PRTP( "Image    ", p->timeImage, p->timeTotal );
        ABC_PRTP( "  build  ",    timeBuild, p->timeTotal );
        ABC_PRTP( "  and-ex ",    timeAndEx, p->timeTotal );
        ABC_PRTP( "  other  ",    timeOther, p->timeTotal );
        ABC_PRTP( "Transfer1", p->timeTran1, p->timeTotal );
        ABC_PRTP( "Transfer2", p->timeTran2, p->timeTotal );
        ABC_PRTP( "Global   ", p->timeGloba, p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal, p->timeTotal );
        ABC_PRTP( "  reo    ", p->timeReo,   p->timeTotal );
        ABC_PRTP( "  reoG   ", p->timeReoG,  p->timeTotal );
    }
    if ( p->ddR->bFunc )
        Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc );
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->ddR, bTemp );
    Vec_PtrFree( p->vRings );
    if ( p->ddG->bFunc )
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc );
    if ( p->ddG->bFunc2 )
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc2 );
//    printf( "manager1\n" );
//    Extra_StopManager( p->dd );
//    printf( "manager2\n" );
    Extra_StopManager( p->ddG );
//    printf( "manager3\n" );
    Extra_StopManager( p->ddR );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
    Vec_PtrFree( p->vLeaves );
    Vec_PtrFree( p->vRoots );
    ABC_FREE( p->pVars2Q );
    ABC_FREE( p->pOrderL );
    ABC_FREE( p->pOrderL2 );
    ABC_FREE( p->pOrderG );
    ABC_FREE( p );
}